

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnModuleName(BinaryReaderIR *this,string_view name)

{
  string_view in_stack_00000000;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (name.size_ != 0) {
    (anonymous_namespace)::MakeDollarName_abi_cxx11_(in_stack_00000000);
    std::__cxx11::string::operator=((string *)&this->module_->name,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}